

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCTestMultiProcessHandler.cxx
# Opt level: O2

void __thiscall
cmCTestMultiProcessHandler::StartTestProcess(cmCTestMultiProcessHandler *this,int test)

{
  PropertiesMap *this_00;
  cmCTest *pcVar1;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *this_01;
  bool bVar2;
  ostream *poVar3;
  mapped_type_conflict1 *pmVar4;
  size_t sVar5;
  cmCTestRunTest *pcVar6;
  mapped_type *ppcVar7;
  _Base_ptr p_Var8;
  bool collapse;
  int test_local;
  cmCTestRunTest *testRun;
  string current_dir;
  
  test_local = test;
  std::__cxx11::ostringstream::ostringstream((ostringstream *)&current_dir);
  poVar3 = std::operator<<((ostream *)&current_dir,"test ");
  poVar3 = (ostream *)std::ostream::operator<<(poVar3,test);
  std::operator<<(poVar3,"\n");
  pcVar1 = this->CTest;
  std::__cxx11::stringbuf::str();
  cmCTest::Log(pcVar1,4,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/fjeremic[P]CMake/Source/CTest/cmCTestMultiProcessHandler.cxx"
               ,0x7f,(char *)testRun,this->Quiet);
  std::__cxx11::string::~string((string *)&testRun);
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)&current_dir);
  pmVar4 = std::map<int,_bool,_std::less<int>,_std::allocator<std::pair<const_int,_bool>_>_>::
           operator[](&this->TestRunningMap,&test_local);
  *pmVar4 = true;
  EraseTest(this,test_local);
  sVar5 = GetProcessorsUsed(this,test_local);
  this->RunningCount = this->RunningCount + sVar5;
  pcVar6 = (cmCTestRunTest *)operator_new(0x210);
  cmCTestRunTest::cmCTestRunTest(pcVar6,this->TestHandler);
  pcVar1 = this->CTest;
  if (pcVar1->RepeatUntilFail == true) {
    pcVar6->RunUntilFail = true;
    pcVar6->NumberOfRunsLeft = pcVar1->RepeatTests;
  }
  pcVar6->Index = test_local;
  this_00 = &this->Properties;
  testRun = pcVar6;
  ppcVar7 = std::
            map<int,_cmCTestTestHandler::cmCTestTestProperties_*,_std::less<int>,_std::allocator<std::pair<const_int,_cmCTestTestHandler::cmCTestTestProperties_*>_>_>
            ::operator[](&this_00->
                          super_map<int,_cmCTestTestHandler::cmCTestTestProperties_*,_std::less<int>,_std::allocator<std::pair<const_int,_cmCTestTestHandler::cmCTestTestProperties_*>_>_>
                         ,&test_local);
  pcVar6->TestProperties = *ppcVar7;
  cmsys::SystemTools::GetCurrentWorkingDirectory_abi_cxx11_
            (&current_dir,(SystemTools *)0x1,collapse);
  ppcVar7 = std::
            map<int,_cmCTestTestHandler::cmCTestTestProperties_*,_std::less<int>,_std::allocator<std::pair<const_int,_cmCTestTestHandler::cmCTestTestProperties_*>_>_>
            ::operator[](&this_00->
                          super_map<int,_cmCTestTestHandler::cmCTestTestProperties_*,_std::less<int>,_std::allocator<std::pair<const_int,_cmCTestTestHandler::cmCTestTestProperties_*>_>_>
                         ,&test_local);
  cmsys::SystemTools::ChangeDirectory(&(*ppcVar7)->Directory);
  LockResources(this,test_local);
  bVar2 = cmCTestRunTest::StartTest(pcVar6,this->Total);
  if (bVar2) {
    std::
    _Rb_tree<cmCTestRunTest*,cmCTestRunTest*,std::_Identity<cmCTestRunTest*>,std::less<cmCTestRunTest*>,std::allocator<cmCTestRunTest*>>
    ::_M_insert_unique<cmCTestRunTest*const&>
              ((_Rb_tree<cmCTestRunTest*,cmCTestRunTest*,std::_Identity<cmCTestRunTest*>,std::less<cmCTestRunTest*>,std::allocator<cmCTestRunTest*>>
                *)&this->RunningTests,&testRun);
  }
  else {
    if (pcVar6->StopTimePassed == true) {
      this->StopTimePassed = true;
      cmCTestRunTest::~cmCTestRunTest(pcVar6);
      operator_delete(pcVar6,0x210);
      goto LAB_0030c9f7;
    }
    for (p_Var8 = (this->Tests).
                  super_map<int,_cmCTestMultiProcessHandler::TestSet,_std::less<int>,_std::allocator<std::pair<const_int,_cmCTestMultiProcessHandler::TestSet>_>_>
                  ._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
        (_Rb_tree_header *)p_Var8 !=
        &(this->Tests).
         super_map<int,_cmCTestMultiProcessHandler::TestSet,_std::less<int>,_std::allocator<std::pair<const_int,_cmCTestMultiProcessHandler::TestSet>_>_>
         ._M_t._M_impl.super__Rb_tree_header; p_Var8 = (_Base_ptr)std::_Rb_tree_increment(p_Var8)) {
      std::_Rb_tree<int,_int,_std::_Identity<int>,_std::less<int>,_std::allocator<int>_>::erase
                ((_Rb_tree<int,_int,_std::_Identity<int>,_std::less<int>,_std::allocator<int>_> *)
                 &p_Var8[1]._M_parent,&test_local);
    }
    UnlockResources(this,test_local);
    this->Completed = this->Completed + 1;
    pmVar4 = std::map<int,_bool,_std::less<int>,_std::allocator<std::pair<const_int,_bool>_>_>::
             operator[](&this->TestFinishMap,&test_local);
    *pmVar4 = true;
    pmVar4 = std::map<int,_bool,_std::less<int>,_std::allocator<std::pair<const_int,_bool>_>_>::
             operator[](&this->TestRunningMap,&test_local);
    *pmVar4 = false;
    sVar5 = GetProcessorsUsed(this,test_local);
    pcVar6 = testRun;
    this->RunningCount = this->RunningCount - sVar5;
    cmCTestRunTest::EndTest(testRun,this->Completed,this->Total,false);
    this_01 = this->Failed;
    ppcVar7 = std::
              map<int,_cmCTestTestHandler::cmCTestTestProperties_*,_std::less<int>,_std::allocator<std::pair<const_int,_cmCTestTestHandler::cmCTestTestProperties_*>_>_>
              ::operator[](&this_00->
                            super_map<int,_cmCTestTestHandler::cmCTestTestProperties_*,_std::less<int>,_std::allocator<std::pair<const_int,_cmCTestTestHandler::cmCTestTestProperties_*>_>_>
                           ,&test_local);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::push_back(this_01,&(*ppcVar7)->Name);
    cmCTestRunTest::~cmCTestRunTest(pcVar6);
    operator_delete(pcVar6,0x210);
  }
  cmsys::SystemTools::ChangeDirectory(&current_dir);
LAB_0030c9f7:
  std::__cxx11::string::~string((string *)&current_dir);
  return;
}

Assistant:

void cmCTestMultiProcessHandler::StartTestProcess(int test)
{
  cmCTestOptionalLog(this->CTest, HANDLER_VERBOSE_OUTPUT,
    "test " << test << "\n", this->Quiet);
  this->TestRunningMap[test] = true; // mark the test as running
  // now remove the test itself
  this->EraseTest(test);
  this->RunningCount += GetProcessorsUsed(test);

  cmCTestRunTest* testRun = new cmCTestRunTest(this->TestHandler);
  if(this->CTest->GetRepeatUntilFail())
    {
    testRun->SetRunUntilFailOn();
    testRun->SetNumberOfRuns(this->CTest->GetTestRepeat());
    }
  testRun->SetIndex(test);
  testRun->SetTestProperties(this->Properties[test]);

  std::string current_dir = cmSystemTools::GetCurrentWorkingDirectory();
  cmSystemTools::ChangeDirectory(this->Properties[test]->Directory);

  // Lock the resources we'll be using
  this->LockResources(test);

  if(testRun->StartTest(this->Total))
    {
    this->RunningTests.insert(testRun);
    }
  else if(testRun->IsStopTimePassed())
    {
    this->StopTimePassed = true;
    delete testRun;
    return;
    }
  else
    {

    for(TestMap::iterator j = this->Tests.begin();
      j != this->Tests.end(); ++j)
      {
      j->second.erase(test);
      }

    this->UnlockResources(test);
    this->Completed++;
    this->TestFinishMap[test] = true;
    this->TestRunningMap[test] = false;
    this->RunningCount -= GetProcessorsUsed(test);
    testRun->EndTest(this->Completed, this->Total, false);
    this->Failed->push_back(this->Properties[test]->Name);
    delete testRun;
    }
  cmSystemTools::ChangeDirectory(current_dir);
}